

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O1

int luv_getnameinfo(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  uv_getnameinfo_t *req;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  code *getnameinfo_cb;
  char *ip;
  sockaddr_storage addr;
  undefined1 local_a8 [32];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  luaL_checktype(L,1,5);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_a8._16_8_ = 0;
  local_a8._24_8_ = 0;
  local_a8._0_2_ = 0;
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  lua_getfield(L,1,"ip");
  iVar1 = lua_isstring(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      luaL_argerror(L,1,"ip property must be string if set");
    }
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
  }
  lua_settop(L,-2);
  lua_getfield(L,1,"port");
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    iVar2 = lua_type(L,-1);
    iVar1 = 0;
    if (iVar2 != 0) {
      luaL_argerror(L,1,"port property must be integer if set");
    }
  }
  else {
    lVar4 = lua_tointegerx(L,-1,(int *)0x0);
    iVar1 = (int)lVar4;
  }
  lua_settop(L,-2);
  if (iVar1 != 0 || pcVar3 != (char *)0x0) {
    ip = "0.0.0.0";
    if (pcVar3 != (char *)0x0) {
      ip = pcVar3;
    }
    iVar2 = uv_ip4_addr(ip,iVar1,(sockaddr_in *)local_a8);
    if (iVar2 == 0) {
      local_a8._0_2_ = 2;
    }
    else {
      iVar1 = uv_ip6_addr(ip,iVar1,(sockaddr_in6 *)local_a8);
      if (iVar1 != 0) {
        iVar1 = luaL_argerror(L,1,"Invalid ip address or port");
        return iVar1;
      }
      local_a8._0_2_ = 10;
    }
  }
  lua_getfield(L,1,"family");
  iVar1 = lua_isnumber(L,-1);
  if (iVar1 == 0) {
    iVar1 = lua_isstring(L,-1);
    if (iVar1 == 0) {
      iVar1 = lua_type(L,-1);
      if (iVar1 != 0) {
        luaL_argerror(L,1,"family must be string if set");
      }
    }
    else {
      pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
      iVar1 = luv_af_string_to_num(pcVar3);
      local_a8._0_2_ = (undefined2)iVar1;
    }
  }
  else {
    lVar4 = lua_tointegerx(L,-1,(int *)0x0);
    local_a8._0_2_ = (undefined2)lVar4;
  }
  lua_settop(L,-2);
  iVar1 = luv_check_continuation(L,2);
  req = (uv_getnameinfo_t *)lua_newuserdata(L,0x528);
  plVar5 = luv_setup_req(L,iVar1);
  req->data = plVar5;
  loop = luv_loop(L);
  getnameinfo_cb = (uv_getnameinfo_cb)0x0;
  if (iVar1 != -2) {
    getnameinfo_cb = luv_getnameinfo_cb;
  }
  iVar2 = uv_getnameinfo(loop,req,getnameinfo_cb,(sockaddr *)local_a8,0);
  if (iVar2 < 0) {
    luv_cleanup_req(L,(luv_req_t *)req->data);
    lua_settop(L,-2);
    luv_error(L,iVar2);
    iVar2 = 3;
  }
  else {
    iVar2 = 1;
    if (iVar1 == -2) {
      lua_settop(L,-2);
      lua_pushstring(L,req->host);
      lua_pushstring(L,req->service);
      luv_cleanup_req(L,(luv_req_t *)req->data);
      iVar2 = 2;
    }
  }
  return iVar2;
}

Assistant:

static int luv_getnameinfo(lua_State* L) {
  uv_getnameinfo_t* req;
  struct sockaddr_storage addr;
  const char* ip = NULL;
  int flags = 0;
  int ret, ref, port = 0;
  luv_ctx_t* ctx = luv_context(L);

  luaL_checktype(L, 1, LUA_TTABLE);
  memset(&addr, 0, sizeof(addr));

  lua_getfield(L, 1, "ip");
  if (lua_isstring(L, -1)) {
    ip = lua_tostring(L, -1);
  }
  else if (!lua_isnil(L, -1)) {
    luaL_argerror(L, 1, "ip property must be string if set");
  }
  lua_pop(L, 1);

  lua_getfield(L, 1, "port");
  if (lua_isnumber(L, -1)) {
    port = lua_tointeger(L, -1);
  }
  else if (!lua_isnil(L, -1)) {
    luaL_argerror(L, 1, "port property must be integer if set");
  }
  lua_pop(L, 1);

  if (ip || port) {
    if (!ip) ip = "0.0.0.0";
    if (!uv_ip4_addr(ip, port, (struct sockaddr_in*)&addr)) {
      addr.ss_family = AF_INET;
    }
    else if (!uv_ip6_addr(ip, port, (struct sockaddr_in6*)&addr)) {
      addr.ss_family = AF_INET6;
    }
    else {
      return luaL_argerror(L, 1, "Invalid ip address or port");
    }
  }

  lua_getfield(L, 1, "family");
  if (lua_isnumber(L, -1)) {
    addr.ss_family = lua_tointeger(L, -1);
  }
  else if (lua_isstring(L, -1)) {
    addr.ss_family = luv_af_string_to_num(lua_tostring(L, -1));
  }
  else if (!lua_isnil(L, -1)) {
    luaL_argerror(L, 1, "family must be string if set");
  }
  lua_pop(L, 1);

  ref = luv_check_continuation(L, 2);

  req = (uv_getnameinfo_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);

  ret = uv_getnameinfo(ctx->loop, req, ref == LUA_NOREF ? NULL : luv_getnameinfo_cb, (struct sockaddr*)&addr, flags);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  if (ref == LUA_NOREF) {
    lua_pop(L, 1);
    lua_pushstring(L, req->host);
    lua_pushstring(L, req->service);
    luv_cleanup_req(L, (luv_req_t*)req->data);
    return 2;
  }
  return 1;
}